

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-uri.cpp
# Opt level: O3

string * __thiscall
nlohmann::json_uri::location_abi_cxx11_(string *__return_storage_ptr__,json_uri *this)

{
  size_type sVar1;
  pointer pcVar2;
  ostream *poVar3;
  stringstream s;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  sVar1 = (this->urn_)._M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::stringstream::stringstream(asStack_198);
    sVar1 = (this->scheme_)._M_string_length;
    if (sVar1 != 0) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_188,(this->scheme_)._M_dataplus._M_p,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"://",3);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_188,(this->authority_)._M_dataplus._M_p,
                        (this->authority_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(this->path_)._M_dataplus._M_p,(this->path_)._M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_198);
    std::ios_base::~ios_base(local_118);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->urn_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string json_uri::location() const
{
	if (urn_.size())
		return urn_;

	std::stringstream s;

	if (scheme_.size() > 0)
		s << scheme_ << "://";

	s << authority_
	  << path_;

	return s.str();
}